

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_structs.c
# Opt level: O0

exr_result_t
internal_exr_alloc_context
          (_internal_exr_context **out,exr_context_initializer_t *initializers,
          _INTERNAL_EXR_CONTEXT_MODE mode,size_t default_size)

{
  code *pcVar1;
  _internal_exr_context *new_index;
  char *pcVar2;
  long in_RCX;
  int in_EDX;
  long in_RSI;
  undefined8 *in_RDI;
  _internal_exr_part *part;
  size_t extra_data;
  int gmaxh;
  int gmaxw;
  _internal_exr_context *ret;
  exr_result_t rv;
  void *memptr;
  long local_48;
  int local_40;
  int local_3c;
  uint in_stack_ffffffffffffffd0;
  exr_result_t eVar3;
  _internal_exr_context *f;
  
  *in_RDI = 0;
  if ((*(long *)(in_RSI + 0x28) != 0) || (local_48 = in_RCX, *(long *)(in_RSI + 0x38) != 0)) {
    local_48 = 0;
  }
  new_index = (_internal_exr_context *)(**(code **)(in_RSI + 0x10))(local_48 + 0x200);
  if (new_index == (_internal_exr_context *)0x0) {
    pcVar1 = *(code **)(in_RSI + 8);
    pcVar2 = exr_get_default_error_message(1);
    (*pcVar1)(0,1,pcVar2);
    eVar3 = 1;
  }
  else {
    memset(new_index,0,0x200);
    new_index->mode = (uint8_t)in_EDX;
    new_index->real_user_data = *(void **)(in_RSI + 0x20);
    if ((*(long *)(in_RSI + 0x28) == 0) && (*(long *)(in_RSI + 0x38) == 0)) {
      if (local_48 != 0) {
        new_index->user_data = new_index + 1;
      }
    }
    else {
      new_index->user_data = *(void **)(in_RSI + 0x20);
    }
    new_index->standard_error = dispatch_standard_error;
    new_index->report_error = dispatch_error;
    new_index->print_error = dispatch_print_error;
    new_index->error_handler_fn = *(exr_error_handler_cb_t *)(in_RSI + 8);
    new_index->alloc_fn = *(exr_memory_allocation_func_t *)(in_RSI + 0x10);
    new_index->free_fn = *(exr_memory_free_func_t *)(in_RSI + 0x18);
    f = new_index;
    exr_get_default_maximum_image_size(&local_3c,&local_40);
    if (*(int *)(in_RSI + 0x48) < 1) {
      new_index->max_image_w = local_3c;
    }
    else {
      new_index->max_image_w = *(int *)(in_RSI + 0x48);
    }
    if ((((0 < new_index->max_image_w) && (0 < local_3c)) && (new_index->max_image_w != 0)) &&
       (local_3c < new_index->max_image_w)) {
      new_index->max_image_w = local_3c;
    }
    if (*(int *)(in_RSI + 0x4c) < 1) {
      new_index->max_image_h = local_40;
    }
    else {
      new_index->max_image_h = *(int *)(in_RSI + 0x4c);
    }
    if (((0 < new_index->max_image_h) && (0 < local_40)) &&
       ((new_index->max_image_h != 0 && (local_40 < new_index->max_image_h)))) {
      new_index->max_image_h = local_40;
    }
    exr_get_default_maximum_tile_size(&local_3c,&local_40);
    if (*(int *)(in_RSI + 0x50) < 1) {
      new_index->max_tile_w = local_3c;
    }
    else {
      new_index->max_tile_w = *(int *)(in_RSI + 0x50);
    }
    if (((0 < new_index->max_tile_w) && (0 < local_3c)) &&
       ((new_index->max_tile_w != 0 && (local_3c < new_index->max_tile_w)))) {
      new_index->max_tile_w = local_3c;
    }
    if (*(int *)(in_RSI + 0x54) < 1) {
      new_index->max_tile_h = local_40;
    }
    else {
      new_index->max_tile_h = *(int *)(in_RSI + 0x54);
    }
    if ((((0 < new_index->max_tile_h) && (0 < local_40)) && (new_index->max_tile_h != 0)) &&
       (local_40 < new_index->max_tile_h)) {
      new_index->max_tile_h = local_40;
    }
    exr_get_default_zip_compression_level(&new_index->default_zip_level);
    exr_get_default_dwa_compression_quality(&new_index->default_dwa_quality);
    if (-1 < *(int *)(in_RSI + 0x58)) {
      new_index->default_zip_level = *(int *)(in_RSI + 0x58);
    }
    if (0.0 <= *(float *)(in_RSI + 0x5c)) {
      new_index->default_dwa_quality = *(float *)(in_RSI + 0x5c);
    }
    if ((*(uint *)(in_RSI + 0x60) & 1) != 0) {
      new_index->strict_header = '\x01';
    }
    if ((*(uint *)(in_RSI + 0x60) & 2) != 0) {
      new_index->silent_header = '\x01';
    }
    new_index->disable_chunk_reconstruct = (byte)*(undefined4 *)(in_RSI + 0x60) & 4;
    new_index->legacy_header = (byte)*(undefined4 *)(in_RSI + 0x60) & 8;
    new_index->file_size = -1;
    new_index->max_name_length = '\x1f';
    new_index->destroy_fn = *(exr_destroy_stream_func_ptr_t *)(in_RSI + 0x40);
    new_index->read_fn = *(exr_read_func_ptr_t *)(in_RSI + 0x28);
    new_index->write_fn = *(exr_write_func_ptr_t *)(in_RSI + 0x38);
    *in_RDI = new_index;
    eVar3 = 0;
    if ((in_EDX != 1) &&
       (eVar3 = internal_exr_add_part
                          (f,(_internal_exr_part **)(ulong)in_stack_ffffffffffffffd0,
                           (int *)new_index), eVar3 != 0)) {
      (**(code **)(in_RSI + 0x18))(f);
      *in_RDI = 0;
    }
  }
  return eVar3;
}

Assistant:

exr_result_t
internal_exr_alloc_context (
    struct _internal_exr_context**   out,
    const exr_context_initializer_t* initializers,
    enum _INTERNAL_EXR_CONTEXT_MODE  mode,
    size_t                           default_size)
{
    void*                         memptr;
    exr_result_t                  rv;
    struct _internal_exr_context* ret;
    *out = NULL;
    int    gmaxw, gmaxh;
    size_t extra_data;

    if (initializers->read_fn || initializers->write_fn)
        extra_data = 0;
    else
        extra_data = default_size;

    memptr = (initializers->alloc_fn) (
        sizeof (struct _internal_exr_context) + extra_data);
    if (memptr)
    {
        memset (memptr, 0, sizeof (struct _internal_exr_context));

        ret       = (struct _internal_exr_context*) memptr;
        ret->mode = (uint8_t) mode;
        /* stash this separately so when a user queries they don't see
         * any of our internal hijinx */
        ret->real_user_data = initializers->user_data;
        if (initializers->read_fn || initializers->write_fn)
            ret->user_data = initializers->user_data;
        else if (extra_data > 0)
            ret->user_data =
                (((uint8_t*) memptr) + sizeof (struct _internal_exr_context));

        ret->standard_error   = &dispatch_standard_error;
        ret->report_error     = &dispatch_error;
        ret->print_error      = &dispatch_print_error;
        ret->error_handler_fn = initializers->error_handler_fn;
        ret->alloc_fn         = initializers->alloc_fn;
        ret->free_fn          = initializers->free_fn;

        exr_get_default_maximum_image_size (&gmaxw, &gmaxh);
        if (initializers->max_image_width <= 0)
            ret->max_image_w = gmaxw;
        else
            ret->max_image_w = initializers->max_image_width;
        if (ret->max_image_w > 0 && gmaxw > 0 && ret->max_image_w &&
            ret->max_image_w > gmaxw)
            ret->max_image_w = gmaxw;

        if (initializers->max_image_height <= 0)
            ret->max_image_h = gmaxh;
        else
            ret->max_image_h = initializers->max_image_height;
        if (ret->max_image_h > 0 && gmaxh > 0 && ret->max_image_h &&
            ret->max_image_h > gmaxh)
            ret->max_image_h = gmaxh;

        exr_get_default_maximum_tile_size (&gmaxw, &gmaxh);
        if (initializers->max_tile_width <= 0)
            ret->max_tile_w = gmaxw;
        else
            ret->max_tile_w = initializers->max_tile_width;
        if (ret->max_tile_w > 0 && gmaxw > 0 && ret->max_tile_w &&
            ret->max_tile_w > gmaxw)
            ret->max_tile_w = gmaxw;

        if (initializers->max_tile_height <= 0)
            ret->max_tile_h = gmaxh;
        else
            ret->max_tile_h = initializers->max_tile_height;
        if (ret->max_tile_h > 0 && gmaxh > 0 && ret->max_tile_h &&
            ret->max_tile_h > gmaxh)
            ret->max_tile_h = gmaxh;

        exr_get_default_zip_compression_level (&ret->default_zip_level);
        exr_get_default_dwa_compression_quality (&ret->default_dwa_quality);
        if (initializers->zip_level >= 0)
            ret->default_zip_level = initializers->zip_level;
        if (initializers->dwa_quality >= 0.f)
            ret->default_dwa_quality = initializers->dwa_quality;

        if (initializers->flags & EXR_CONTEXT_FLAG_STRICT_HEADER)
            ret->strict_header = 1;
        if (initializers->flags & EXR_CONTEXT_FLAG_SILENT_HEADER_PARSE)
            ret->silent_header = 1;
        ret->disable_chunk_reconstruct =
            (initializers->flags &
             EXR_CONTEXT_FLAG_DISABLE_CHUNK_RECONSTRUCTION);
        ret->legacy_header = (initializers->flags & EXR_CONTEXT_FLAG_WRITE_LEGACY_HEADER);

        ret->file_size       = -1;
        ret->max_name_length = EXR_SHORTNAME_MAXLEN;

        ret->destroy_fn = initializers->destroy_fn;
        ret->read_fn    = initializers->read_fn;
        ret->write_fn   = initializers->write_fn;

#ifdef ILMTHREAD_THREADING_ENABLED
#    ifdef _WIN32
        InitializeCriticalSection (&(ret->mutex));
#    else
        rv = pthread_mutex_init (&(ret->mutex), NULL);
        if (rv != 0)
        {
            /* fairly unlikely... */
            (initializers->free_fn) (memptr);
            *out = NULL;
            return EXR_ERR_OUT_OF_MEMORY;
        }
#    endif
#endif

        *out = ret;
        rv   = EXR_ERR_SUCCESS;

        /* if we are reading the file, go ahead and set up the first
         * part to make parsing logic easier */
        if (mode != EXR_CONTEXT_WRITE)
        {
            struct _internal_exr_part* part;
            rv = internal_exr_add_part (ret, &part, NULL);
            if (rv != EXR_ERR_SUCCESS)
            {
                /* this should never happen since we reserve space for
                 * one in the struct, but maybe we changed
                 * something */
                (initializers->free_fn) (memptr);
                *out = NULL;
            }
        }
    }
    else
    {
        (initializers->error_handler_fn) (
            NULL,
            EXR_ERR_OUT_OF_MEMORY,
            exr_get_default_error_message (EXR_ERR_OUT_OF_MEMORY));
        rv = EXR_ERR_OUT_OF_MEMORY;
    }

    return rv;
}